

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O3

FT_Error T1_Get_MM_Blend(T1_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  uint axis_count;
  PS_Blend pPVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  FT_Fixed axiscoords [4];
  FT_Fixed aFStack_38 [4];
  
  pPVar1 = face->blend;
  if (pPVar1 != (PS_Blend)0x0) {
    uVar5 = (ulong)num_coords;
    axis_count = pPVar1->num_axis;
    mm_weights_unmap(pPVar1->weight_vector,aFStack_38,axis_count);
    uVar4 = axis_count;
    if (num_coords <= axis_count) {
      uVar4 = num_coords;
    }
    if (uVar4 != 0) {
      if (axis_count < num_coords) {
        uVar5 = (ulong)axis_count;
      }
      memcpy(coords,aFStack_38,uVar5 << 3);
    }
    auVar3 = _DAT_002f57d0;
    auVar2 = _DAT_002ef930;
    if (axis_count < num_coords) {
      uVar4 = ~axis_count + num_coords;
      auVar6._4_4_ = 0;
      auVar6._0_4_ = uVar4;
      auVar6._8_4_ = uVar4;
      auVar6._12_4_ = 0;
      uVar5 = 0;
      auVar6 = auVar6 ^ _DAT_002ef930;
      do {
        auVar7._8_4_ = (int)uVar5;
        auVar7._0_8_ = uVar5;
        auVar7._12_4_ = (int)(uVar5 >> 0x20);
        auVar7 = (auVar7 | auVar3) ^ auVar2;
        if ((bool)(~(auVar7._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar7._0_4_ ||
                    auVar6._4_4_ < auVar7._4_4_) & 1)) {
          coords[axis_count + uVar5] = 0x8000;
        }
        if ((auVar7._12_4_ != auVar6._12_4_ || auVar7._8_4_ <= auVar6._8_4_) &&
            auVar7._12_4_ <= auVar6._12_4_) {
          coords[(ulong)axis_count + uVar5 + 1] = 0x8000;
        }
        uVar5 = uVar5 + 2;
      } while (((ulong)uVar4 + 2 & 0xfffffffffffffffe) != uVar5);
    }
    return 0;
  }
  return 6;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Get_MM_Blend( T1_Face    face,
                   FT_UInt    num_coords,
                   FT_Fixed*  coords )
  {
    PS_Blend  blend = face->blend;

    FT_Fixed  axiscoords[4];
    FT_UInt   i, nc;


    if ( !blend )
      return FT_THROW( Invalid_Argument );

    mm_weights_unmap( blend->weight_vector,
                      axiscoords,
                      blend->num_axis );

    nc = num_coords;
    if ( num_coords > blend->num_axis )
    {
      FT_TRACE2(( "T1_Get_MM_Blend: only using first %d of %d coordinates\n",
                  blend->num_axis, num_coords ));
      nc = blend->num_axis;
    }

    for ( i = 0; i < nc; i++ )
      coords[i] = axiscoords[i];
    for ( ; i < num_coords; i++ )
      coords[i] = 0x8000;

    return FT_Err_Ok;
  }